

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

void __thiscall cmdline::parser::set_option(parser *this,string *name,string *value)

{
  uint uVar1;
  size_type sVar2;
  mapped_type *ppoVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *value_local;
  string *name_local;
  parser *this_local;
  
  local_20 = value;
  value_local = name;
  name_local = (string *)this;
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
          ::count(&this->options,name);
  if (sVar2 == 0) {
    std::operator+(&local_40,"undefined option: --",value_local);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->errors,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    ppoVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
              ::operator[](&this->options,value_local);
    uVar1 = (*(*ppoVar3)->_vptr_option_base[4])(*ppoVar3,local_20);
    if ((uVar1 & 1) == 0) {
      std::operator+(&local_b0,"option value is invalid: --",value_local);
      std::operator+(&local_90,&local_b0,"=");
      std::operator+(&local_70,&local_90,local_20);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->errors,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
    }
  }
  return;
}

Assistant:

void set_option(const std::string
            &name,
            const std::string
            &value){
                if (options.count(name) == 0) {
                    errors.push_back("undefined option: --" + name);
                    return;
                }
                if (!options[name]->set(value)) {
                    errors.push_back("option value is invalid: --" + name + "=" + value);
                    return;
                }
            }